

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::Btree_BtreeMultimapEmplace_Test::~Btree_BtreeMultimapEmplace_Test
          (Btree_BtreeMultimapEmplace_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, BtreeMultimapEmplace) {
        const int key_to_insert = 123456;
        const char value0[] = "a";
        phmap::btree_multimap<int, std::string> s;
        auto iter = s.emplace(key_to_insert, value0);
        ASSERT_NE(iter, s.end());
        EXPECT_EQ(iter->first, key_to_insert);
        EXPECT_EQ(iter->second, value0);
        const char value1[] = "b";
        auto iter2 = s.emplace(key_to_insert, value1);
        EXPECT_NE(iter2, iter);
        ASSERT_NE(iter2, s.end());
        EXPECT_EQ(iter2->first, key_to_insert);
        EXPECT_EQ(iter2->second, value1);
        auto result = s.equal_range(key_to_insert);
        EXPECT_EQ(std::distance(result.first, result.second), 2);
    }